

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

void cortex_a9_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  
  obj[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0x5f3] | 0x220001920)
  ;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc090;
  obj[1].tb_jmp_cache[0x63a] = (TranslationBlock *)0x111111111110222;
  obj[1].tb_jmp_cache[0x647] = (TranslationBlock *)0x8003800341033090;
  obj[1].tb_jmp_cache[0x648] = (TranslationBlock *)0x103100c50078;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 0x11;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x3514100000000000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x2000000000100103;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x211101230000;
  obj[1].tb_jmp_cache[0x634] = (TranslationBlock *)0x1311211100101111;
  obj[1].tb_jmp_cache[0x635] = (TranslationBlock *)0x1111213121232041;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x111142;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64f) = 0x9000003;
  obj[1].tb_jmp_cache[0x651] = (TranslationBlock *)0xe00fe019;
  obj[1].tb_jmp_cache[0x652] = (TranslationBlock *)0x200fe019;
  define_arm_cp_regs_with_opaque_arm((ARMCPU *)obj,cortexa9_cp_reginfo,(void *)0x0);
  return;
}

Assistant:

static void cortex_a9_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V7);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_THUMB2EE);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    /* Note that A9 supports the MP extensions even for
     * A9UP and single-core A9MP (which are both different
     * and valid configurations; we don't model A9UP).
     */
    set_feature(&cpu->env, ARM_FEATURE_V7MP);
    set_feature(&cpu->env, ARM_FEATURE_CBAR);
    cpu->midr = 0x410fc090;
    cpu->reset_fpsid = 0x41033090;
    cpu->isar.mvfr0 = 0x11110222;
    cpu->isar.mvfr1 = 0x01111111;
    cpu->ctr = 0x80038003;
    cpu->reset_sctlr = 0x00c50078;
    cpu->id_pfr0 = 0x1031;
    cpu->id_pfr1 = 0x11;
    cpu->isar.id_dfr0 = 0x000;
    cpu->id_afr0 = 0;
    cpu->isar.id_mmfr0 = 0x00100103;
    cpu->isar.id_mmfr1 = 0x20000000;
    cpu->isar.id_mmfr2 = 0x01230000;
    cpu->isar.id_mmfr3 = 0x00002111;
    cpu->isar.id_isar0 = 0x00101111;
    cpu->isar.id_isar1 = 0x13112111;
    cpu->isar.id_isar2 = 0x21232041;
    cpu->isar.id_isar3 = 0x11112131;
    cpu->isar.id_isar4 = 0x00111142;
    cpu->isar.dbgdidr = 0x35141000;
    cpu->clidr = (1 << 27) | (1 << 24) | 3;
    cpu->ccsidr[0] = 0xe00fe019; /* 16k L1 dcache. */
    cpu->ccsidr[1] = 0x200fe019; /* 16k L1 icache. */
    define_arm_cp_regs(cpu, cortexa9_cp_reginfo);
}